

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian-util.c
# Opt level: O3

void write_le32(uint32_t val,uchar **buffer)

{
  uchar *puVar1;
  
  **buffer = (uchar)val;
  puVar1 = *buffer;
  *buffer = puVar1 + 1;
  puVar1[1] = (uchar)(val >> 8);
  puVar1 = *buffer;
  *buffer = puVar1 + 1;
  puVar1[1] = (uchar)(val >> 0x10);
  puVar1 = *buffer;
  *buffer = puVar1 + 1;
  puVar1[1] = (uchar)(val >> 0x18);
  *buffer = *buffer + 1;
  return;
}

Assistant:

void write_le32(uint32_t val, unsigned char **buffer)
{
	**(uint8_t **)buffer = (val & 0xff);
	(*buffer) ++;
	**(uint8_t **)buffer = (val & 0xff00) >> 8;
	(*buffer) ++;
	**(uint8_t **)buffer = (val & 0xff0000) >> 16;
	(*buffer) ++;
	**(uint8_t **)buffer = (val & 0xff000000) >> 24;
	(*buffer) ++;
}